

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall QDockAreaLayoutInfo::clear(QDockAreaLayoutInfo *this)

{
  long lVar1;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRect *this_00;
  undefined4 local_18;
  int iStack_14;
  undefined4 uStack_10;
  int iStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QList<QDockAreaLayoutItem>::clear((QList<QDockAreaLayoutItem> *)in_RDI);
  QRect::QRect(this_00);
  in_RDI[2].x2.m_i = local_18;
  in_RDI[2].y2.m_i = iStack_14;
  *(undefined4 *)&((DataPointer *)&in_RDI[3].x1)->d = uStack_10;
  in_RDI[3].y1.m_i = iStack_c;
  *(undefined1 *)&in_RDI[5].x2.m_i = 0;
  in_RDI[6].x1 = 0;
  in_RDI[6].y1 = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayoutInfo::clear()
{
    item_list.clear();
    rect = QRect();
#if QT_CONFIG(tabbar)
    tabbed = false;
    tabBar = nullptr;
#endif
}